

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
          (RuleBasedBreakIterator *this,RuleBasedBreakIterator *other)

{
  UErrorCode status;
  UnicodeString local_60;
  
  BreakIterator::BreakIterator(&this->super_BreakIterator,&other->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_003da830;
  local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
  local_60.fUnion.fStackFields.fLengthAndFlags = 2;
  StringCharacterIterator::StringCharacterIterator(&this->fSCharIter,&local_60);
  UnicodeString::~UnicodeString(&local_60);
  local_60.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)((ulong)local_60.super_Replaceable.super_UObject._vptr_UObject & 0xffffffff00000000)
  ;
  init(this,(EVP_PKEY_CTX *)&local_60);
  operator=(this,other);
  return;
}

Assistant:

RuleBasedBreakIterator::RuleBasedBreakIterator(const RuleBasedBreakIterator& other)
: BreakIterator(other),
  fSCharIter(UnicodeString())
{
    UErrorCode status = U_ZERO_ERROR;
    this->init(status);
    *this = other;
}